

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_DoublingFactorCounterTest_AllTriplets_ThreeClosedTriplets_Test::
~TEST_DoublingFactorCounterTest_AllTriplets_ThreeClosedTriplets_Test
          (TEST_DoublingFactorCounterTest_AllTriplets_ThreeClosedTriplets_Test *this)

{
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::
  ~TEST_GROUP_CppUTestGroupDoublingFactorCounterTest
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest);
  operator_delete(this,0xc0);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, AllTriplets_ThreeClosedTriplets)
{
	addPair(Tile::WestWind);
	addTriplet(Tile::OneOfCharacters, false);
	addTriplet(Tile::TwoOfCircles, false);
	addTriplet(Tile::ThreeOfBamboos, false);
	addTriplet(Tile::SevenOfCharacters, false);

	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::AllTriplets));
	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeClosedTriplets));
	CHECK_EQUAL(4, r.doubling_factor);
}